

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_transaction_base.cpp
# Opt level: O0

TransactionController *
cfd::api::TransactionApiBase::UpdateWitnessStack<cfd::TransactionController>
          (function<cfd::TransactionController_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
           *create_controller,string *tx_hex,Txid *txid,uint32_t vout,
          SignParameter *update_sign_param,uint32_t stack_index)

{
  ulong uVar1;
  string *message;
  SignParameter *in_RDX;
  CfdException *in_RSI;
  TransactionController *in_RDI;
  TransactionController *txc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  function<cfd::TransactionController_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_stack_ffffffffffffff48;
  allocator *paVar2;
  TransactionController *pTVar3;
  Txid *in_stack_ffffffffffffff68;
  TransactionController *in_stack_ffffffffffffff70;
  allocator local_69;
  string local_68 [32];
  CfdSourceLocation local_48 [2];
  
  pTVar3 = in_RDI;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) != 0) {
    local_48[0].filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/cfdapi_transaction_base.cpp"
                 ,0x2f);
    local_48[0].filename = local_48[0].filename + 1;
    local_48[0].line = 0xcb;
    local_48[0].funcname = "UpdateWitnessStack";
    core::logger::warn<>(local_48,"Failed to UpdateWitnessStack. hex empty.");
    message = (string *)__cxa_allocate_exception(0x30);
    paVar2 = &local_69;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"Invalid hex string. empty data.",paVar2);
    core::CfdException::CfdException(in_RSI,(CfdError)((ulong)paVar2 >> 0x20),message);
    __cxa_throw(message,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  std::
  function<cfd::TransactionController_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::operator()(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  SignParameter::ConvertToSignature(in_RDX);
  TransactionController::SetWitnessStack
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,(uint32_t)((ulong)pTVar3 >> 0x20),
             (uint32_t)pTVar3,(ByteData *)in_RDI);
  core::ByteData::~ByteData((ByteData *)0x5713a8);
  return pTVar3;
}

Assistant:

T TransactionApiBase::UpdateWitnessStack(
    std::function<T(const std::string&)> create_controller,
    const std::string& tx_hex, const Txid& txid, uint32_t vout,
    const SignParameter& update_sign_param, uint32_t stack_index) {
  if (tx_hex.empty()) {
    warn(CFD_LOG_SOURCE, "Failed to UpdateWitnessStack. hex empty.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid hex string. empty data.");
  }

  T txc = create_controller(tx_hex);

  txc.SetWitnessStack(
      txid, vout, stack_index, update_sign_param.ConvertToSignature());
  return txc;
}